

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void __thiscall AAmbientSound::Tick(AAmbientSound *this)

{
  bool bVar1;
  uint uVar2;
  FSoundID *this_00;
  float local_4c;
  FSoundID local_38;
  float local_34;
  float local_30;
  float max;
  float min;
  float local_24;
  float usevol;
  float volscale;
  FAmbientSound *pFStack_18;
  int loop;
  FAmbientSound *ambient;
  AAmbientSound *this_local;
  
  ambient = (FAmbientSound *)this;
  AActor::Tick(&this->super_AActor);
  if ((((this->super_AActor).field_0x4bc & 1) != 0) && (this->NextCheck <= ::level.maptime)) {
    volscale = 0.0;
    pFStack_18 = TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::CheckKey
                           (&Ambients,(this->super_AActor).args[0]);
    if (pFStack_18 != (FAmbientSound *)0x0) {
      if ((pFStack_18->type & 3) == 3) {
        volscale = 3.58732e-43;
      }
      this_00 = &pFStack_18->sound;
      FSoundID::FSoundID((FSoundID *)&usevol,0);
      bVar1 = FSoundID::operator!=(this_00,(FSoundID *)&usevol);
      if (bVar1) {
        if ((this->super_AActor).args[1] == 0) {
          local_4c = 1.0;
        }
        else {
          local_4c = (float)(this->super_AActor).args[1] / 100.0;
        }
        local_24 = local_4c;
        min = clamp<float>(pFStack_18->volume * local_4c,0.0,1.0);
        if (((this->super_AActor).args[2] == 0 && (this->super_AActor).args[3] == 0) ||
           ((this->super_AActor).args[3] < (this->super_AActor).args[2])) {
          uVar2 = (uint)volscale | 4;
          FSoundID::FSoundID((FSoundID *)&max,&pFStack_18->sound);
          S_Sound(&this->super_AActor,uVar2,(FSoundID *)&max,min,pFStack_18->attenuation);
        }
        else {
          local_30 = (float)(this->super_AActor).args[2];
          local_34 = (float)(this->super_AActor).args[3];
          if (0 < (this->super_AActor).args[4]) {
            local_30 = (float)(this->super_AActor).args[4] * local_30;
            local_34 = (float)(this->super_AActor).args[4] * local_34;
          }
          uVar2 = (uint)volscale | 4;
          FSoundID::FSoundID(&local_38,&pFStack_18->sound);
          S_SoundMinMaxDist(&this->super_AActor,uVar2,&local_38,min,local_30,local_34);
        }
        if (volscale == 0.0) {
          SetTicker(this,pFStack_18);
        }
        else {
          this->NextCheck = 0x7fffffff;
        }
      }
      else {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      }
    }
  }
  return;
}

Assistant:

void AAmbientSound::Tick ()
{
	Super::Tick ();

	if (!bActive || level.maptime < NextCheck)
		return;

	FAmbientSound *ambient;
	int loop = 0;

	ambient = Ambients.CheckKey(args[0]);
	if (ambient == NULL)
	{
		return;
	}

	if ((ambient->type & CONTINUOUS) == CONTINUOUS)
	{
		loop = CHAN_LOOP;
	}

	if (ambient->sound != FSoundID(0))
	{
		// The second argument scales the ambient sound's volume.
		// 0 and 100 are normal volume. The maximum volume level
		// possible is always 1.
		float volscale = args[1] == 0 ? 1 : args[1] / 100.f;
		float usevol = clamp(ambient->volume * volscale, 0.f, 1.f);

		// The third argument is the minimum distance for audible fading, and
		// the fourth argument is the maximum distance for audibility. Setting
		// either of these to 0 or setting  min distance > max distance will
		// use the standard rolloff.
		if ((args[2] | args[3]) == 0 || args[2] > args[3])
		{
			S_Sound(this, CHAN_BODY | loop, ambient->sound, usevol, ambient->attenuation);
		}
		else
		{
			float min = float(args[2]), max = float(args[3]);
			// The fifth argument acts as a scalar for the preceding two, if it's non-zero.
			if (args[4] > 0)
			{
				min *= args[4];
				max *= args[4];
			}
			S_SoundMinMaxDist(this, CHAN_BODY | loop, ambient->sound, usevol, min, max);
		}
		if (!loop)
		{
			SetTicker (ambient);
		}
		else
		{
			NextCheck = INT_MAX;
		}
	}
	else
	{
		Destroy ();
	}
}